

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_nlm.hpp
# Opt level: O2

value_type_conflict7 * __thiscall
poplar::compact_bonsai_nlm<int,_8UL>::insert
          (compact_bonsai_nlm<int,_8UL> *this,uint64_t pos,char_range *key)

{
  byte *pbVar1;
  uint8_t *puVar2;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> _Var3;
  uint64_t uVar4;
  uint8_t *puVar5;
  uint64_t uVar6;
  pointer __p_00;
  uint uVar7;
  ulong chunk_id;
  pointer __p;
  value_type_conflict7 *pvVar8;
  uint8_t *dst;
  uint8_t *puVar9;
  pair<unsigned_long,_unsigned_long> pVar10;
  pointer __p_1;
  __uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> local_38;
  
  uVar7 = (uint)pos & 7;
  chunk_id = pos >> 3;
  pbVar1 = (this->chunks_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start + chunk_id;
  *pbVar1 = *pbVar1 | '\x01' << (sbyte)uVar7;
  this->size_ = this->size_ + 1;
  if (*(long *)((long)&(((this->ptrs_).
                         super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> +
               (pos & 0xfffffffffffffff8)) == 0) {
    puVar9 = (uint8_t *)0x0;
    if (key->begin != key->end) {
      puVar9 = key->end + ~(ulong)key->begin;
    }
    uVar6 = vbyte::size((uint64_t)(puVar9 + 4));
    puVar2 = puVar9 + uVar6 + 4;
    this->label_bytes_ = (uint64_t)(puVar2 + this->label_bytes_);
    __p_00 = (pointer)operator_new__((ulong)puVar2);
    memset(__p_00,0,(size_t)puVar2);
    local_38._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
         (_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>)0x0;
    std::__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>::reset
              ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> *)
               ((this->ptrs_).
                super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + chunk_id),__p_00);
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
              ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_38);
    _Var3.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (this->ptrs_).
         super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[chunk_id]._M_t.
         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>;
    uVar6 = vbyte::encode((uint8_t *)
                          _Var3.
                          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                          .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                          (uint64_t)(puVar9 + 4));
    puVar5 = (uint8_t *)
             ((long)_Var3.
                    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
                    .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + uVar6);
    copy_bytes(puVar5,key->begin,(uint64_t)puVar9);
    puVar2 = puVar9 + (long)puVar5;
    puVar2[0] = '\0';
    puVar2[1] = '\0';
    puVar2[2] = '\0';
    puVar2[3] = '\0';
    pvVar8 = (value_type_conflict7 *)(puVar5 + (long)puVar9);
  }
  else {
    pVar10 = get_allocs_(this,chunk_id,(ulong)uVar7);
    uVar6 = pVar10.first;
    puVar9 = (uint8_t *)0x0;
    if (key->begin != key->end) {
      puVar9 = key->end + ~(ulong)key->begin;
    }
    uVar4 = vbyte::size((uint64_t)(puVar9 + 4));
    this->label_bytes_ = (uint64_t)(puVar9 + this->label_bytes_ + uVar4 + 4);
    puVar5 = (uint8_t *)operator_new__((ulong)(puVar9 + pVar10.second + uVar6 + uVar4 + 4));
    memset(puVar5,0,(size_t)(puVar9 + pVar10.second + uVar6 + uVar4 + 4));
    _Var3.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (this->ptrs_).
         super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[chunk_id]._M_t.
         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>;
    copy_bytes(puVar5,(uint8_t *)
                      _Var3.
                      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                      .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,uVar6);
    uVar4 = vbyte::encode(puVar5 + uVar6,(uint64_t)(puVar9 + 4));
    dst = puVar5 + uVar6 + uVar4;
    copy_bytes(dst,key->begin,(uint64_t)puVar9);
    puVar2 = puVar9 + 4 + (long)dst;
    pvVar8 = (value_type_conflict7 *)(dst + (long)puVar9);
    puVar2[-4] = '\0';
    puVar2[-3] = '\0';
    puVar2[-2] = '\0';
    puVar2[-1] = '\0';
    copy_bytes(puVar2,(uint8_t *)
                      ((long)_Var3.
                             super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                             .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + uVar6),
               pVar10.second);
    local_38._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
         (_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>)0x0;
    std::__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>::reset
              ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> *)
               ((this->ptrs_).
                super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + chunk_id),puVar5);
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
              ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_38);
  }
  return pvVar8;
}

Assistant:

value_type* insert(uint64_t pos, const char_range& key) {
        auto [chunk_id, pos_in_chunk] = decompose_value<ChunkSize>(pos);

        assert(!bit_tools::get_bit(chunks_[chunk_id], pos_in_chunk));
        bit_tools::set_bit(chunks_[chunk_id], pos_in_chunk);

        ++size_;

#ifdef POPLAR_EXTRA_STATS
        max_length_ = std::max<uint64_t>(max_length_, key.length());
        sum_length_ += key.length();
#endif

        if (!ptrs_[chunk_id]) {
            // First association in the group
            uint64_t length = key.empty() ? 0 : key.length() - 1;
            uint64_t new_alloc = vbyte::size(length + sizeof(value_type)) + length + sizeof(value_type);
            label_bytes_ += new_alloc;

            ptrs_[chunk_id] = std::make_unique<uint8_t[]>(new_alloc);
            uint8_t* ptr = ptrs_[chunk_id].get();

            ptr += vbyte::encode(ptr, length + sizeof(value_type));
            copy_bytes(ptr, key.begin, length);

            auto ret_ptr = reinterpret_cast<value_type*>(ptr + length);
            *ret_ptr = static_cast<value_type>(0);

            return ret_ptr;
        }

        // Second and subsequent association in the group
        auto fr_alloc = get_allocs_(chunk_id, pos_in_chunk);

        const uint64_t len = key.empty() ? 0 : key.length() - 1;
        const uint64_t new_alloc = vbyte::size(len + sizeof(value_type)) + len + sizeof(value_type);
        label_bytes_ += new_alloc;

        auto new_unique = std::make_unique<uint8_t[]>(fr_alloc.first + new_alloc + fr_alloc.second);

        // Get raw pointers
        const uint8_t* orig_ptr = ptrs_[chunk_id].get();
        uint8_t* new_ptr = new_unique.get();

        // Copy the front allocation
        copy_bytes(new_ptr, orig_ptr, fr_alloc.first);
        orig_ptr += fr_alloc.first;
        new_ptr += fr_alloc.first;

        // Set new allocation
        new_ptr += vbyte::encode(new_ptr, len + sizeof(value_type));
        copy_bytes(new_ptr, key.begin, len);
        new_ptr += len;
        *reinterpret_cast<value_type*>(new_ptr) = static_cast<value_type>(0);

        // Copy the back allocation
        copy_bytes(new_ptr + sizeof(value_type), orig_ptr, fr_alloc.second);

        // Overwrite
        ptrs_[chunk_id] = std::move(new_unique);

        return reinterpret_cast<value_type*>(new_ptr);
    }